

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O0

Mat_<double> * cvlinspace(Mat_<double> *__return_storage_ptr__,double min_,double max_,int length)

{
  double *pdVar1;
  undefined4 local_2c;
  int i;
  int length_local;
  double max__local;
  double min__local;
  Mat_<double> *cvmat;
  
  cv::Mat_<double>::Mat_(__return_storage_ptr__,1,length);
  for (local_2c = 0; local_2c < length; local_2c = local_2c + 1) {
    pdVar1 = cv::Mat_<double>::operator()(__return_storage_ptr__,0,local_2c);
    *pdVar1 = ((max_ - min_) / (double)(length + -1)) * (double)local_2c + min_;
  }
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> cvlinspace(double min_, double max_, int length) {
    auto cvmat = cv::Mat_<double>(1, length);
    for (int i = 0; i < length; i++) {
        cvmat(0, i) = ((max_ - min_) / (length - 1) * i) + min_;
    }
    return cvmat;
}